

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined8 *puVar10;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ushort uVar11;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar12 [16];
  __m128i res;
  __m128i pred;
  __m128i A3_hi;
  __m128i A2_hi;
  __m128i bit_fix_hi;
  __m128i A1_hi;
  __m128i avg_hi;
  __m128i sum_hi;
  __m128i TL_hi;
  __m128i T_hi;
  __m128i L_hi;
  __m128i A3_lo;
  __m128i A2_lo;
  __m128i bit_fix_lo;
  __m128i A1_lo;
  __m128i avg_lo;
  __m128i sum_lo;
  __m128i TL_lo;
  __m128i T_lo;
  __m128i L_lo;
  __m128i A4_hi;
  __m128i A4_lo;
  __m128i TL;
  __m128i T;
  __m128i src;
  __m128i L;
  __m128i zero;
  int i;
  int local_334;
  char local_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  byte local_258;
  byte bStack_257;
  byte bStack_256;
  byte bStack_255;
  byte bStack_254;
  byte bStack_253;
  byte bStack_252;
  byte bStack_251;
  byte local_238;
  byte bStack_237;
  byte bStack_236;
  byte bStack_235;
  byte bStack_234;
  byte bStack_233;
  byte bStack_232;
  byte bStack_231;
  byte local_218;
  byte bStack_217;
  byte bStack_216;
  byte bStack_215;
  byte bStack_214;
  byte bStack_213;
  byte bStack_212;
  byte bStack_211;
  byte bStack_1f0;
  byte bStack_1ef;
  byte bStack_1ee;
  byte bStack_1ed;
  byte bStack_1ec;
  byte bStack_1eb;
  byte bStack_1ea;
  byte bStack_1e9;
  byte bStack_1d0;
  byte bStack_1cf;
  byte bStack_1ce;
  byte bStack_1cd;
  byte bStack_1cc;
  byte bStack_1cb;
  byte bStack_1ca;
  byte bStack_1c9;
  byte bStack_1b0;
  byte bStack_1af;
  byte bStack_1ae;
  byte bStack_1ad;
  byte bStack_1ac;
  byte bStack_1ab;
  byte bStack_1aa;
  byte bStack_1a9;
  ushort uStack_186;
  ushort uStack_184;
  ushort uStack_182;
  ushort uStack_17e;
  ushort uStack_17c;
  ushort uStack_17a;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  
  for (local_334 = 0; local_334 + 4 <= in_EDX; local_334 = local_334 + 4) {
    puVar10 = (undefined8 *)(in_RDI + (long)(local_334 + -1) * 4);
    uVar1 = *puVar10;
    uVar2 = puVar10[1];
    puVar10 = (undefined8 *)(in_RDI + (long)local_334 * 4);
    uVar3 = *puVar10;
    uVar4 = puVar10[1];
    puVar10 = (undefined8 *)(in_RSI + (long)local_334 * 4);
    uVar5 = *puVar10;
    uVar6 = puVar10[1];
    puVar10 = (undefined8 *)(in_RSI + (long)(local_334 + -1) * 4);
    uVar7 = *puVar10;
    uVar8 = puVar10[1];
    local_218 = (byte)uVar1;
    bStack_217 = (byte)((ulong)uVar1 >> 8);
    bStack_216 = (byte)((ulong)uVar1 >> 0x10);
    bStack_215 = (byte)((ulong)uVar1 >> 0x18);
    bStack_214 = (byte)((ulong)uVar1 >> 0x20);
    bStack_213 = (byte)((ulong)uVar1 >> 0x28);
    bStack_212 = (byte)((ulong)uVar1 >> 0x30);
    bStack_211 = (byte)((ulong)uVar1 >> 0x38);
    local_238 = (byte)uVar5;
    bStack_237 = (byte)((ulong)uVar5 >> 8);
    bStack_236 = (byte)((ulong)uVar5 >> 0x10);
    bStack_235 = (byte)((ulong)uVar5 >> 0x18);
    bStack_234 = (byte)((ulong)uVar5 >> 0x20);
    bStack_233 = (byte)((ulong)uVar5 >> 0x28);
    bStack_232 = (byte)((ulong)uVar5 >> 0x30);
    bStack_231 = (byte)((ulong)uVar5 >> 0x38);
    local_258 = (byte)uVar7;
    bStack_257 = (byte)((ulong)uVar7 >> 8);
    bStack_256 = (byte)((ulong)uVar7 >> 0x10);
    bStack_255 = (byte)((ulong)uVar7 >> 0x18);
    bStack_254 = (byte)((ulong)uVar7 >> 0x20);
    bStack_253 = (byte)((ulong)uVar7 >> 0x28);
    bStack_252 = (byte)((ulong)uVar7 >> 0x30);
    bStack_251 = (byte)((ulong)uVar7 >> 0x38);
    uStack_b6 = (ushort)bStack_237;
    uStack_b4 = (ushort)bStack_236;
    uStack_b2 = (ushort)bStack_235;
    uStack_ae = (ushort)bStack_233;
    uStack_ac = (ushort)bStack_232;
    uStack_aa = (ushort)bStack_231;
    uStack_c6 = (ushort)bStack_217;
    uStack_c4 = (ushort)bStack_216;
    uStack_c2 = (ushort)bStack_215;
    uStack_be = (ushort)bStack_213;
    uStack_bc = (ushort)bStack_212;
    uStack_ba = (ushort)bStack_211;
    uVar11 = (ushort)((ushort)local_238 + (ushort)local_218) >> 1;
    uVar13 = (ushort)(uStack_b6 + uStack_c6) >> 1;
    uVar14 = (ushort)(uStack_b4 + uStack_c4) >> 1;
    uVar15 = (ushort)(uStack_b2 + uStack_c2) >> 1;
    uVar16 = (ushort)((ushort)bStack_234 + (ushort)bStack_214) >> 1;
    uVar17 = (ushort)(uStack_ae + uStack_be) >> 1;
    uVar18 = (ushort)(uStack_ac + uStack_bc) >> 1;
    uVar19 = (ushort)(uStack_aa + uStack_ba) >> 1;
    uStack_146 = (ushort)bStack_257;
    uStack_144 = (ushort)bStack_256;
    uStack_142 = (ushort)bStack_255;
    uStack_13e = (ushort)bStack_253;
    uStack_13c = (ushort)bStack_252;
    uStack_13a = (ushort)bStack_251;
    uStack_56 = (ushort)bStack_257;
    uStack_54 = (ushort)bStack_256;
    uStack_52 = (ushort)bStack_255;
    uStack_4e = (ushort)bStack_253;
    uStack_4c = (ushort)bStack_252;
    uStack_4a = (ushort)bStack_251;
    auVar9._2_2_ = (uVar13 - uStack_146) + (ushort)(uVar13 < uStack_56);
    auVar9._0_2_ = (uVar11 - local_258) + (ushort)(uVar11 < local_258);
    auVar9._4_2_ = (uVar14 - uStack_144) + (ushort)(uVar14 < uStack_54);
    auVar9._6_2_ = (uVar15 - uStack_142) + (ushort)(uVar15 < uStack_52);
    auVar9._10_2_ = (uVar17 - uStack_13e) + (ushort)(uVar17 < uStack_4e);
    auVar9._8_2_ = (uVar16 - bStack_254) + (ushort)(uVar16 < bStack_254);
    auVar9._12_2_ = (uVar18 - uStack_13c) + (ushort)(uVar18 < uStack_4c);
    auVar9._14_2_ = (uVar19 - uStack_13a) + (ushort)(uVar19 < uStack_4a);
    auVar12 = psraw(auVar9,ZEXT416(1));
    local_e8 = auVar12._0_2_;
    sStack_e6 = auVar12._2_2_;
    sStack_e4 = auVar12._4_2_;
    sStack_e2 = auVar12._6_2_;
    sStack_e0 = auVar12._8_2_;
    sStack_de = auVar12._10_2_;
    sStack_dc = auVar12._12_2_;
    sStack_da = auVar12._14_2_;
    local_e8 = uVar11 + local_e8;
    sStack_e6 = uVar13 + sStack_e6;
    sStack_e4 = uVar14 + sStack_e4;
    sStack_e2 = uVar15 + sStack_e2;
    sStack_e0 = uVar16 + sStack_e0;
    sStack_de = uVar17 + sStack_de;
    sStack_dc = uVar18 + sStack_dc;
    sStack_da = uVar19 + sStack_da;
    bStack_1b0 = (byte)uVar2;
    bStack_1af = (byte)((ulong)uVar2 >> 8);
    bStack_1ae = (byte)((ulong)uVar2 >> 0x10);
    bStack_1ad = (byte)((ulong)uVar2 >> 0x18);
    bStack_1ac = (byte)((ulong)uVar2 >> 0x20);
    bStack_1ab = (byte)((ulong)uVar2 >> 0x28);
    bStack_1aa = (byte)((ulong)uVar2 >> 0x30);
    bStack_1a9 = (byte)((ulong)uVar2 >> 0x38);
    bStack_1d0 = (byte)uVar6;
    bStack_1cf = (byte)((ulong)uVar6 >> 8);
    bStack_1ce = (byte)((ulong)uVar6 >> 0x10);
    bStack_1cd = (byte)((ulong)uVar6 >> 0x18);
    bStack_1cc = (byte)((ulong)uVar6 >> 0x20);
    bStack_1cb = (byte)((ulong)uVar6 >> 0x28);
    bStack_1ca = (byte)((ulong)uVar6 >> 0x30);
    bStack_1c9 = (byte)((ulong)uVar6 >> 0x38);
    bStack_1f0 = (byte)uVar8;
    bStack_1ef = (byte)((ulong)uVar8 >> 8);
    bStack_1ee = (byte)((ulong)uVar8 >> 0x10);
    bStack_1ed = (byte)((ulong)uVar8 >> 0x18);
    bStack_1ec = (byte)((ulong)uVar8 >> 0x20);
    bStack_1eb = (byte)((ulong)uVar8 >> 0x28);
    bStack_1ea = (byte)((ulong)uVar8 >> 0x30);
    bStack_1e9 = (byte)((ulong)uVar8 >> 0x38);
    uStack_f6 = (ushort)bStack_1cf;
    uStack_f4 = (ushort)bStack_1ce;
    uStack_f2 = (ushort)bStack_1cd;
    uStack_ee = (ushort)bStack_1cb;
    uStack_ec = (ushort)bStack_1ca;
    uStack_ea = (ushort)bStack_1c9;
    uStack_106 = (ushort)bStack_1af;
    uStack_104 = (ushort)bStack_1ae;
    uStack_102 = (ushort)bStack_1ad;
    uStack_fe = (ushort)bStack_1ab;
    uStack_fc = (ushort)bStack_1aa;
    uStack_fa = (ushort)bStack_1a9;
    uVar11 = (ushort)((ushort)bStack_1d0 + (ushort)bStack_1b0) >> 1;
    uVar13 = (ushort)(uStack_f6 + uStack_106) >> 1;
    uVar14 = (ushort)(uStack_f4 + uStack_104) >> 1;
    uVar15 = (ushort)(uStack_f2 + uStack_102) >> 1;
    uVar16 = (ushort)((ushort)bStack_1cc + (ushort)bStack_1ac) >> 1;
    uVar17 = (ushort)(uStack_ee + uStack_fe) >> 1;
    uVar18 = (ushort)(uStack_ec + uStack_fc) >> 1;
    uVar19 = (ushort)(uStack_ea + uStack_fa) >> 1;
    uStack_186 = (ushort)bStack_1ef;
    uStack_184 = (ushort)bStack_1ee;
    uStack_182 = (ushort)bStack_1ed;
    uStack_17e = (ushort)bStack_1eb;
    uStack_17c = (ushort)bStack_1ea;
    uStack_17a = (ushort)bStack_1e9;
    uStack_76 = (ushort)bStack_1ef;
    uStack_74 = (ushort)bStack_1ee;
    uStack_72 = (ushort)bStack_1ed;
    uStack_6e = (ushort)bStack_1eb;
    uStack_6c = (ushort)bStack_1ea;
    uStack_6a = (ushort)bStack_1e9;
    auVar12._2_2_ = (uVar13 - uStack_186) + (ushort)(uVar13 < uStack_76);
    auVar12._0_2_ = (uVar11 - bStack_1f0) + (ushort)(uVar11 < bStack_1f0);
    auVar12._4_2_ = (uVar14 - uStack_184) + (ushort)(uVar14 < uStack_74);
    auVar12._6_2_ = (uVar15 - uStack_182) + (ushort)(uVar15 < uStack_72);
    auVar12._10_2_ = (uVar17 - uStack_17e) + (ushort)(uVar17 < uStack_6e);
    auVar12._8_2_ = (uVar16 - bStack_1ec) + (ushort)(uVar16 < bStack_1ec);
    auVar12._12_2_ = (uVar18 - uStack_17c) + (ushort)(uVar18 < uStack_6c);
    auVar12._14_2_ = (uVar19 - uStack_17a) + (ushort)(uVar19 < uStack_6a);
    auVar12 = psraw(auVar12,ZEXT416(1));
    local_128 = auVar12._0_2_;
    sStack_126 = auVar12._2_2_;
    sStack_124 = auVar12._4_2_;
    sStack_122 = auVar12._6_2_;
    sStack_120 = auVar12._8_2_;
    sStack_11e = auVar12._10_2_;
    sStack_11c = auVar12._12_2_;
    sStack_11a = auVar12._14_2_;
    local_128 = uVar11 + local_128;
    sStack_126 = uVar13 + sStack_126;
    sStack_124 = uVar14 + sStack_124;
    sStack_122 = uVar15 + sStack_122;
    sStack_120 = uVar16 + sStack_120;
    sStack_11e = uVar17 + sStack_11e;
    sStack_11c = uVar18 + sStack_11c;
    sStack_11a = uVar19 + sStack_11a;
    local_2a8 = (char)uVar3;
    cStack_2a7 = (char)((ulong)uVar3 >> 8);
    cStack_2a6 = (char)((ulong)uVar3 >> 0x10);
    cStack_2a5 = (char)((ulong)uVar3 >> 0x18);
    cStack_2a4 = (char)((ulong)uVar3 >> 0x20);
    cStack_2a3 = (char)((ulong)uVar3 >> 0x28);
    cStack_2a2 = (char)((ulong)uVar3 >> 0x30);
    cStack_2a1 = (char)((ulong)uVar3 >> 0x38);
    cStack_2a0 = (char)uVar4;
    cStack_29f = (char)((ulong)uVar4 >> 8);
    cStack_29e = (char)((ulong)uVar4 >> 0x10);
    cStack_29d = (char)((ulong)uVar4 >> 0x18);
    cStack_29c = (char)((ulong)uVar4 >> 0x20);
    cStack_29b = (char)((ulong)uVar4 >> 0x28);
    cStack_29a = (char)((ulong)uVar4 >> 0x30);
    cStack_299 = (char)((ulong)uVar4 >> 0x38);
    puVar10 = (undefined8 *)(in_RCX + (long)local_334 * 4);
    *puVar10 = CONCAT17(cStack_2a1 -
                        ((0 < sStack_da) * (sStack_da < 0x100) * (char)sStack_da -
                        (0xff < sStack_da)),
                        CONCAT16(cStack_2a2 -
                                 ((0 < sStack_dc) * (sStack_dc < 0x100) * (char)sStack_dc -
                                 (0xff < sStack_dc)),
                                 CONCAT15(cStack_2a3 -
                                          ((0 < sStack_de) * (sStack_de < 0x100) * (char)sStack_de -
                                          (0xff < sStack_de)),
                                          CONCAT14(cStack_2a4 -
                                                   ((0 < sStack_e0) * (sStack_e0 < 0x100) *
                                                    (char)sStack_e0 - (0xff < sStack_e0)),
                                                   CONCAT13(cStack_2a5 -
                                                            ((0 < sStack_e2) * (sStack_e2 < 0x100) *
                                                             (char)sStack_e2 - (0xff < sStack_e2)),
                                                            CONCAT12(cStack_2a6 -
                                                                     ((0 < sStack_e4) *
                                                                      (sStack_e4 < 0x100) *
                                                                      (char)sStack_e4 -
                                                                     (0xff < sStack_e4)),
                                                                     CONCAT11(cStack_2a7 -
                                                                              ((0 < sStack_e6) *
                                                                               (sStack_e6 < 0x100) *
                                                                               (char)sStack_e6 -
                                                                              (0xff < sStack_e6)),
                                                                              local_2a8 -
                                                                              ((0 < local_e8) *
                                                                               (local_e8 < 0x100) *
                                                                               (char)local_e8 -
                                                                              (0xff < local_e8))))))
                                         )));
    puVar10[1] = CONCAT17(cStack_299 -
                          ((0 < sStack_11a) * (sStack_11a < 0x100) * (char)sStack_11a -
                          (0xff < sStack_11a)),
                          CONCAT16(cStack_29a -
                                   ((0 < sStack_11c) * (sStack_11c < 0x100) * (char)sStack_11c -
                                   (0xff < sStack_11c)),
                                   CONCAT15(cStack_29b -
                                            ((0 < sStack_11e) * (sStack_11e < 0x100) *
                                             (char)sStack_11e - (0xff < sStack_11e)),
                                            CONCAT14(cStack_29c -
                                                     ((0 < sStack_120) * (sStack_120 < 0x100) *
                                                      (char)sStack_120 - (0xff < sStack_120)),
                                                     CONCAT13(cStack_29d -
                                                              ((0 < sStack_122) *
                                                               (sStack_122 < 0x100) *
                                                               (char)sStack_122 -
                                                              (0xff < sStack_122)),
                                                              CONCAT12(cStack_29e -
                                                                       ((0 < sStack_124) *
                                                                        (sStack_124 < 0x100) *
                                                                        (char)sStack_124 -
                                                                       (0xff < sStack_124)),
                                                                       CONCAT11(cStack_29f -
                                                                                ((0 < sStack_126) *
                                                                                 (sStack_126 < 0x100
                                                                                 ) * (char)
                                                  sStack_126 - (0xff < sStack_126)),
                                                  cStack_2a0 -
                                                  ((0 < local_128) * (local_128 < 0x100) *
                                                   (char)local_128 - (0xff < local_128)))))))));
  }
  if (local_334 != in_EDX) {
    (*VP8LPredictorsSub_C[0xd])
              ((uint32_t *)(in_RDI + (long)local_334 * 4),(uint32_t *)(in_RSI + (long)local_334 * 4)
               ,in_EDX - local_334,(uint32_t *)(in_RCX + (long)local_334 * 4));
  }
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    __m128i A4_lo, A4_hi;
    // lo.
    {
      const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
      const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
      const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
      const __m128i sum_lo = _mm_add_epi16(T_lo, L_lo);
      const __m128i avg_lo = _mm_srli_epi16(sum_lo, 1);
      const __m128i A1_lo = _mm_sub_epi16(avg_lo, TL_lo);
      const __m128i bit_fix_lo = _mm_cmpgt_epi16(TL_lo, avg_lo);
      const __m128i A2_lo = _mm_sub_epi16(A1_lo, bit_fix_lo);
      const __m128i A3_lo = _mm_srai_epi16(A2_lo, 1);
      A4_lo = _mm_add_epi16(avg_lo, A3_lo);
    }
    // hi.
    {
      const __m128i L_hi = _mm_unpackhi_epi8(L, zero);
      const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
      const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
      const __m128i sum_hi = _mm_add_epi16(T_hi, L_hi);
      const __m128i avg_hi = _mm_srli_epi16(sum_hi, 1);
      const __m128i A1_hi = _mm_sub_epi16(avg_hi, TL_hi);
      const __m128i bit_fix_hi = _mm_cmpgt_epi16(TL_hi, avg_hi);
      const __m128i A2_hi = _mm_sub_epi16(A1_hi, bit_fix_hi);
      const __m128i A3_hi = _mm_srai_epi16(A2_hi, 1);
      A4_hi = _mm_add_epi16(avg_hi, A3_hi);
    }
    {
      const __m128i pred = _mm_packus_epi16(A4_lo, A4_hi);
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}